

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O3

void __thiscall slang::ast::TypePrinter::printScope(TypePrinter *this,Scope *scope)

{
  FormatBuffer *this_00;
  Scope *in_RDX;
  string local_30;
  
  if ((this->options).elideScopeNames == false) {
    this_00 = (this->buffer)._M_t.
              super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
              _M_t.
              super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
              .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
    getLexicalPath_abi_cxx11_(&local_30,(ast *)scope,in_RDX);
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)this_00,local_30._M_dataplus._M_p,
               local_30._M_dataplus._M_p + local_30._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void TypePrinter::printScope(const Scope* scope) {
    if (options.elideScopeNames)
        return;

    buffer->append(getLexicalPath(scope));
}